

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_rect nk_layout_widget_bounds(nk_context *ctx)

{
  nk_panel *pnVar1;
  nk_rect nVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  float local_38;
  nk_panel *layout;
  nk_window *win;
  nk_context *ctx_local;
  nk_rect ret;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x45f9,"struct nk_rect nk_layout_widget_bounds(struct nk_context *)");
  }
  if (ctx->current != (nk_window *)0x0) {
    if (ctx->current->layout != (nk_panel *)0x0) {
      pnVar1 = ctx->current->layout;
      uVar3 = pnVar1->at_x;
      uVar4 = pnVar1->at_y;
      nVar2.y = (float)uVar4;
      nVar2.x = (float)uVar3;
      if (0.0 <= pnVar1->at_x - (pnVar1->bounds).x) {
        local_38 = pnVar1->at_x - (pnVar1->bounds).x;
      }
      else {
        local_38 = 0.0;
      }
      nVar2.w = (pnVar1->bounds).w - local_38;
      nVar2.h = (pnVar1->row).height;
      return nVar2;
    }
    __assert_fail("ctx->current->layout",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x45fb,"struct nk_rect nk_layout_widget_bounds(struct nk_context *)");
  }
  __assert_fail("ctx->current",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                ,0x45fa,"struct nk_rect nk_layout_widget_bounds(struct nk_context *)");
}

Assistant:

NK_API struct nk_rect
nk_layout_widget_bounds(struct nk_context *ctx)
{
    struct nk_rect ret;
    struct nk_window *win;
    struct nk_panel *layout;

    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    win = ctx->current;
    layout = win->layout;

    ret.x = layout->at_x;
    ret.y = layout->at_y;
    ret.w = layout->bounds.w - NK_MAX(layout->at_x - layout->bounds.x,0);
    ret.h = layout->row.height;
    return ret;
}